

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

string * __thiscall
gnuplotio::Gnuplot::
binfmt<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,undefined8 param_2,undefined8 arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arr_or_rec)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream tmp;
  string local_1d8 [64];
  ostream local_198;
  
  bVar1 = std::operator==(arr_or_rec,"array");
  if (!bVar1) {
    bVar1 = std::operator==(arr_or_rec,"record");
    if (!bVar1) {
      __assert_fail("(arr_or_rec == \"array\") || (arr_or_rec == \"record\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/dstahlke[P]gnuplot-iostream/gnuplot-iostream.h"
                    ,0x706,
                    "std::string gnuplotio::Gnuplot::binfmt(const T &, const std::string &, OrganizationMode) [T = std::vector<std::pair<double, double>>, OrganizationMode = gnuplotio::Mode1D]"
                   );
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::operator<<(&local_198," format=\'");
  handle_colunwrap_tag<1ul,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::ModeBinfmt>
            (&local_198,arg);
  poVar2 = std::operator<<(&local_198,"\' ");
  poVar2 = std::operator<<(poVar2,(string *)arr_or_rec);
  std::operator<<(poVar2,"=(");
  handle_colunwrap_tag<1ul,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::ModeSize>
            (&local_198,arg);
  std::operator<<(&local_198,")");
  std::operator<<(&local_198," ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string binfmt(const T &arg, const std::string &arr_or_rec, OrganizationMode) {
        assert((arr_or_rec == "array") || (arr_or_rec == "record"));
        std::string ret;
        try {
            std::ostringstream tmp;
            tmp << " format='";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
            tmp << "' " << arr_or_rec << "=(";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
            tmp << ")";
            tmp << " ";
            ret = tmp.str();
        } catch(const plotting_empty_container &) {
            ret = std::string(" format='' ") + arr_or_rec + "=(0) ";
        }
        return ret;
    }